

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O2

void __thiscall Vector<double>::Vector(Vector<double> *this,int csize,double *val)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  
  this->num_elts = 0;
  this->ptr_to_data = (double *)0x0;
  if (csize < 1) {
    uVar3 = 0;
    pdVar1 = (double *)0x0;
  }
  else {
    this->num_elts = csize;
    uVar3 = (ulong)(uint)csize;
    pdVar1 = (double *)operator_new__(uVar3 * 8);
    this->ptr_to_data = pdVar1;
  }
  for (pdVar2 = pdVar1 + uVar3; pdVar1 < pdVar2; pdVar2 = pdVar2 + -1) {
    pdVar2[-1] = *val;
  }
  return;
}

Assistant:

Vector< T >::Vector(int csize, const T& val) : num_elts(0), ptr_to_data((T*)0)
{
#ifdef DEBUG
	std::cerr << "Vector<>::Vector(int, const T& )|size constructor   |";
#endif

    if (csize > 0 ){
	num_elts = csize;
	ptr_to_data = new T[num_elts];

	if ( ptr_to_data == 0 ) error("Vector<>::Vector(), Memoire insuffisante");
    } 

  T* p = ptr_to_data + num_elts;
  while ( p > ptr_to_data ) 
    *--p = val;//pb si = n'est pas surcharge pour le type T

#ifdef DEBUG
    fprintf(stderr," adr =  %x \n", ptr_to_data);
#endif
}